

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O3

void __thiscall
Wasm::WasmBytecodeGenerator::EmitBlockCommon
          (WasmBytecodeGenerator *this,BlockInfo *blockInfo,bool *endOnElse)

{
  uint uVar1;
  FunctionBody *pFVar2;
  code *pcVar3;
  bool bVar4;
  WasmOp op;
  int iVar5;
  uint sourceContextId;
  undefined4 *puVar6;
  FunctionInfo *pFVar7;
  WasmBinaryReader *pWVar8;
  undefined1 uVar9;
  undefined2 op_00;
  PolymorphicEmitInfo PVar10;
  PolymorphicEmitInfo expectedTypes;
  uint local_48;
  PolymorphicEmitInfo info;
  
  EnsureStackAvailable(this);
  uVar9 = this->isUnreachable;
  EnterEvalStackScope(this,blockInfo);
  if (endOnElse != (bool *)0x0) {
    *endOnElse = false;
  }
  while( true ) {
    pWVar8 = (WasmBinaryReader *)(this->m_funcInfo->m_customReader).ptr;
    if (pWVar8 == (WasmBinaryReader *)0x0) {
      pWVar8 = (this->m_module->m_reader).ptr;
    }
    iVar5 = (*(pWVar8->super_WasmReaderBase)._vptr_WasmReaderBase[2])();
    op = (WasmOp)iVar5;
    if (op == wbEnd) break;
    if ((endOnElse != (bool *)0x0) && (op == wbElse)) {
      *endOnElse = true;
      op_00 = wbElse;
LAB_00f1ceec:
      pFVar2 = (this->m_funcInfo->m_body).ptr;
      if (pFVar2 == (FunctionBody *)0x0) {
        bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,WasmBytecodePhase);
      }
      else {
        info.field_1.singleInfo.type._0_2_ = op_00;
        sourceContextId = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar2);
        pFVar2 = (this->m_funcInfo->m_body).ptr;
        pFVar7 = (pFVar2->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
        if (pFVar7 == (FunctionInfo *)0x0) {
          AssertCount = AssertCount + 1;
          info.field_1.singleInfo.type._3_1_ = uVar9;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar6 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/../Runtime/Base/FunctionBody.h"
                             ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
          if (!bVar4) {
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          *puVar6 = 0;
          pFVar7 = (pFVar2->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
          uVar9 = info.field_1.singleInfo.type._3_1_;
        }
        bVar4 = Js::Phases::IsEnabled
                          ((Phases *)&DAT_015b6718,WasmBytecodePhase,sourceContextId,
                           pFVar7->functionId);
        op_00 = info.field_1.singleInfo.type._0_2_;
      }
      if (bVar4) {
        PrintOpBegin(this,op_00);
      }
      uVar1 = (blockInfo->yieldInfo).count;
      expectedTypes._0_8_ = (BlockInfo *)CONCAT44(0,uVar1);
      if (uVar1 != 0) {
        expectedTypes.field_1.infos = (blockInfo->yieldInfo).field_1.infos;
        PVar10 = PopStackPolymorphic(this,expectedTypes,(char16 *)0x0);
        info._0_8_ = PVar10.field_1;
        expectedTypes._0_8_ = (BlockInfo *)&local_48;
        local_48 = PVar10.count;
        PVar10._4_4_ = 0;
        PVar10.count = local_48;
        PVar10.field_1 =
             (anon_union_8_2_2e7736b0_for_PolymorphicEmitInfo_1)
             (anon_union_8_2_2e7736b0_for_PolymorphicEmitInfo_1)info._0_8_;
        YieldToBlock(this,blockInfo,PVar10);
        ReleaseLocation(this,(PolymorphicEmitInfo *)expectedTypes._0_8_);
      }
      ExitEvalStackScope(this,expectedTypes._0_8_);
      if (uVar9 == '\0') {
        this->m_writer = this->m_originalWriter;
        this->isUnreachable = false;
      }
      return;
    }
    EmitExpr(this,op);
  }
  op_00 = wbEnd;
  goto LAB_00f1ceec;
}

Assistant:

void WasmBytecodeGenerator::EmitBlockCommon(BlockInfo* blockInfo, bool* endOnElse /*= nullptr*/)
{
    EnsureStackAvailable();
    bool canResetUnreachable = !IsUnreachable();
    WasmOp op;
    EnterEvalStackScope(blockInfo);

    if(endOnElse) *endOnElse = false;
    do {
        op = GetReader()->ReadExpr();
        if (op == wbEnd)
        {
            break;
        }
        if (endOnElse && op == wbElse)
        {
            *endOnElse = true;
            break;
        }
        EmitExpr(op);
    } while (true);
    DebugPrintOp(op);
    if (blockInfo->HasYield())
    {
        PolymorphicEmitInfo info = PopStackPolymorphic(blockInfo);
        YieldToBlock(blockInfo, info);
        ReleaseLocation(&info);
    }
    ExitEvalStackScope(blockInfo);
    if (canResetUnreachable)
    {
        SetUnreachableState(false);
    }
}